

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabConv.cpp
# Opt level: O0

void amrex::RealDescriptor::convertFromNativeFloatFormat
               (ostream *os,Long nitems,float *in,RealDescriptor *od)

{
  long lVar1;
  void *pvVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  long *plVar7;
  IntDescriptor *in_RDX;
  long in_RSI;
  char *in_RDI;
  Long put;
  char *bufr;
  StreamRetry sr;
  float *inSave;
  Long buffSize;
  Long nitemsSave;
  StreamRetry *in_stack_00000728;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined8 in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffeb0;
  ostream *in_stack_fffffffffffffeb8;
  StreamRetry *in_stack_fffffffffffffec0;
  long local_f8;
  long local_f0;
  void *local_e8;
  allocator local_c9;
  string local_c8 [64];
  RealDescriptor *in_stack_ffffffffffffff78;
  RealDescriptor *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  Long in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  long local_10;
  char *local_8;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  lVar6 = (long)writeBufferSize;
  local_10 = in_RSI;
  local_8 = in_RDI;
  plVar7 = std::min<long>((long *)&stack0xffffffffffffffc8,&local_10);
  lVar1 = *plVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"RD_cFNF",&local_c9);
  StreamRetry::StreamRetry
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,iVar5);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  while (bVar4 = StreamRetry::TryOutput(in_stack_00000728), bVar4) {
    local_10 = in_RSI;
    iVar5 = numBytes((RealDescriptor *)0xfa4741);
    local_e8 = operator_new__(lVar1 * iVar5);
    for (; 0 < local_10; local_10 = local_10 - local_f0) {
      local_f8 = (long)writeBufferSize;
      plVar7 = std::min<long>(&local_f8,&local_10);
      local_f0 = *plVar7;
      FPC::Native32RealDescriptor();
      FPC::NativeLongDescriptor();
      in_stack_fffffffffffffe80 = 0;
      PD_convert(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                 in_RDX,(int)lVar6);
      pcVar3 = local_8;
      pvVar2 = local_e8;
      numBytes((RealDescriptor *)0xfa4856);
      std::ostream::write(pcVar3,(long)pvVar2);
    }
    if (local_e8 != (void *)0x0) {
      operator_delete__(local_e8);
    }
  }
  StreamRetry::~StreamRetry
            ((StreamRetry *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  return;
}

Assistant:

void
RealDescriptor::convertFromNativeFloatFormat (std::ostream&         os,
                                              Long                  nitems,
                                              const float*          in,
                                              const RealDescriptor& od)
{
//  BL_PROFILE("RD:convertFromNativeFloatFormat");
  Long nitemsSave(nitems);
  Long buffSize(std::min(Long(writeBufferSize), nitems));
  const float *inSave(in);
  amrex::StreamRetry sr(os, "RD_cFNF", 4);

  while(sr.TryOutput()) {
    nitems = nitemsSave;
    in = inSave;

    char *bufr = new char[buffSize * od.numBytes()];

    while (nitems > 0)
    {
        Long put = std::min(static_cast<Long>(writeBufferSize), nitems);
        PD_convert(bufr,
                   in,
                   put,
                   0,
                   od,
                   FPC::Native32RealDescriptor(),
                   FPC::NativeLongDescriptor());
        os.write(bufr, od.numBytes()*put);
        nitems -= put;
        in     += put;
    }

    delete [] bufr;
  }
}